

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

path * __thiscall boost::filesystem::path::remove_trailing_separator(path *this)

{
  size_type sVar1;
  
  sVar1 = (this->m_pathname)._M_string_length;
  if ((sVar1 != 0) && ((this->m_pathname)._M_dataplus._M_p[sVar1 - 1] == '/')) {
    std::__cxx11::string::erase((ulong)this,sVar1 - 1);
  }
  return this;
}

Assistant:

path&  path::remove_trailing_separator()
  {
    if (!m_pathname.empty() && is_separator(m_pathname[m_pathname.size() - 1]))
      m_pathname.erase(m_pathname.size() - 1);
    return *this;
  }